

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::SquareMatrix::verifySize(int LS,int NE,int NT)

{
  char *in_RAX;
  undefined8 *puVar1;
  int args_1;
  int iVar2;
  char *args;
  
  args_1 = NT - NE;
  iVar2 = NE + -1;
  if (LS == 0) {
    iVar2 = iVar2 * iVar2;
    if (args_1 == iVar2) {
      return;
    }
    tools::Log::error<char_const*>(in_RAX);
    args = "Expected ((NE-1)^2): {}";
  }
  else {
    iVar2 = (iVar2 * NE) / 2;
    if (args_1 == iVar2) {
      return;
    }
    tools::Log::error<char_const*>(in_RAX);
    args = "Expected (NE*(NE-1)/2): {}";
  }
  tools::Log::info<char_const*,int>(args,iVar2);
  tools::Log::info<char_const*,int>("Observed value: {}",args_1);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int LS, int NE, int NT ) {

  int num_values = NT-NE;

  // symmetric matrix
  if ( LS ) {

    if ( num_values != NE*(NE-1)/2 ) {

      Log::error( "Inconsistent number of values in symetric square matrix" );
      Log::info( "Expected (NE*(NE-1)/2): {}", NE*(NE-1)/2 );
      Log::info( "Observed value: {}", num_values );
      throw std::exception();
    }
  }

  // asymmetric matrix
  else {

    if ( num_values != (NE-1)*(NE-1) ) {

      Log::error( "Inconsistent number of values in symetric square matrix" );
      Log::info( "Expected ((NE-1)^2): {}", (NE-1)*(NE-1) );
      Log::info( "Observed value: {}", num_values );
      throw std::exception();
    }
  }

}